

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwd.hh
# Opt level: O1

void tchecker::ts::prev<tchecker::ta::ta_t>
               (ta_t *bwd_impl,const_state_t *s,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  bool bVar1;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  __begin0;
  incoming_edges_range_t in_edges;
  tuple<tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
  local_6d0;
  undefined1 local_678 [320];
  incoming_edges_iterator_t local_538;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  local_358;
  
  ta::ta_t::incoming_edges((incoming_edges_range_t *)&local_358,bwd_impl,s);
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_678,&local_358);
  while( true ) {
    bVar1 = syncprod::incoming_edges_iterator_t::operator==
                      (&local_538,(end_iterator_t *)(local_678 + 0x138));
    if (bVar1) break;
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator*(&local_6d0,
                (edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                 *)local_678);
    ta::ta_t::prev(bwd_impl,s,&local_6d0,v,mask);
    range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::~range_t
              (&local_6d0.
                super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                .
                super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>
                ._M_head_impl.edges);
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator++((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                  *)local_678);
  }
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_678);
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t(&local_358);
  return;
}

Assistant:

void prev(BWD_IMPL & bwd_impl, typename BWD_IMPL::const_state_t const & s, std::vector<typename BWD_IMPL::sst_t> & v,
          tchecker::state_status_t mask)
{
  typename BWD_IMPL::incoming_edges_range_t in_edges = bwd_impl.incoming_edges(s);
  for (typename BWD_IMPL::incoming_edges_value_t && in_edge : in_edges)
    bwd_impl.prev(s, in_edge, v, mask);
}